

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_joystick_events.c
# Opt level: O0

void draw_joystick_axes(ALLEGRO_JOYSTICK *joy,int cx,int cy,int stick)

{
  ALLEGRO_FONT *pAVar1;
  int iVar2;
  undefined8 uVar3;
  int in_ECX;
  int iVar4;
  int iVar5;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int i;
  int z;
  int y;
  int x;
  int zx;
  int osize;
  int csize;
  int size;
  int local_34;
  
  iVar4 = (int)(joys[in_ECX][0] * 30.0 + (float)in_ESI);
  iVar5 = (int)(joys[in_ECX][1] * 30.0 + (float)in_EDX);
  iVar2 = (int)(joys[in_ECX][2] * 30.0 + (float)in_EDX);
  al_draw_filled_rectangle
            ((float)(in_ESI + -0x23),(float)(in_EDX + -0x23),(float)(in_ESI + 0x23),
             (float)(in_EDX + 0x23),grey._0_8_,grey._8_8_);
  dVar6 = (double)(in_ESI + -0x23) + 0.5;
  dVar7 = (double)(in_EDX + -0x23) + 0.5;
  dVar8 = (double)(in_ESI + 0x23) - 0.5;
  dVar9 = (double)(in_EDX + 0x23) - 0.5;
  al_draw_rectangle(CONCAT44((int)((ulong)dVar6 >> 0x20),(float)dVar6),
                    CONCAT44((int)((ulong)dVar7 >> 0x20),(float)dVar7),
                    CONCAT44((int)((ulong)dVar8 >> 0x20),(float)dVar8),
                    CONCAT44((int)((ulong)dVar9 >> 0x20),(float)dVar9),black._0_8_,black._8_8_,0);
  al_draw_filled_rectangle
            ((float)(iVar4 + -5),(float)(iVar5 + -5),(float)(iVar4 + 5),(float)(iVar5 + 5),
             black._0_8_,black._8_8_);
  if (2 < num_axes[in_ECX]) {
    al_draw_filled_rectangle
              ((float)(in_ESI + 0x28),(float)(in_EDX + -0x23),(float)(in_ESI + 0x32),
               (float)(in_EDX + 0x23),grey._0_8_,grey._8_8_);
    al_draw_rectangle((float)(in_ESI + 0x28) + 0.5,(float)(in_EDX + -0x23) + 0.5,
                      (float)(in_ESI + 0x32) - 0.5,(float)(in_EDX + 0x23) - 0.5,black._0_8_,
                      black._8_8_,0);
    al_draw_filled_rectangle
              ((float)(in_ESI + 0x28),(float)(iVar2 + -5),(float)(in_ESI + 0x32),(float)(iVar2 + 5),
               black._0_8_,black._8_8_);
  }
  pAVar1 = font;
  if (in_RDI != 0) {
    uVar3 = al_get_joystick_stick_name(in_RDI,in_ECX);
    al_draw_text(black._0_8_,black._8_8_,(float)in_ESI,(float)(in_EDX + 0x24),pAVar1,1,uVar3);
    for (local_34 = 0; pAVar1 = font, local_34 < num_axes[in_ECX]; local_34 = local_34 + 1) {
      uVar3 = al_get_joystick_axis_name(in_RDI,in_ECX);
      al_draw_text(black._0_8_,black._8_8_,(float)in_ESI,(float)(in_EDX + 0x2d + local_34 * 10),
                   pAVar1,1,uVar3);
    }
  }
  return;
}

Assistant:

static void draw_joystick_axes(ALLEGRO_JOYSTICK *joy, int cx, int cy, int stick)
{
   const int size = 30;
   const int csize = 5;
   const int osize = size + csize;
   int zx = cx + osize + csize * 2;
   int x = cx + joys[stick][0] * size;
   int y = cy + joys[stick][1] * size;
   int z = cy + joys[stick][2] * size;
   int i;

   al_draw_filled_rectangle(cx-osize, cy-osize, cx+osize, cy+osize, grey);
   al_draw_rectangle(cx-osize+0.5, cy-osize+0.5, cx+osize-0.5, cy+osize-0.5, black, 0);
   al_draw_filled_rectangle(x-5, y-5, x+5, y+5, black);

   if (num_axes[stick] >= 3) {
      al_draw_filled_rectangle(zx-csize, cy-osize, zx+csize, cy+osize, grey);
      al_draw_rectangle(zx-csize+0.5f, cy-osize+0.5f, zx+csize-0.5f, cy+osize-0.5f, black, 0);
      al_draw_filled_rectangle(zx-5, z-5, zx+5, z+5, black);
   }

   if (joy) {
      al_draw_text(font, black, cx, cy + osize + 1, ALLEGRO_ALIGN_CENTRE,
         al_get_joystick_stick_name(joy, stick));
      for (i = 0; i < num_axes[stick]; i++) {
         al_draw_text(font, black, cx, cy + osize + (1 + i) * 10,
            ALLEGRO_ALIGN_CENTRE,
            al_get_joystick_axis_name(joy, stick, i));
      }
   }
}